

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O3

int encoder_append_uint_value(ndn_encoder_t *encoder,uint64_t value)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  if (value < 0x100) {
    uVar3 = encoder->offset;
    if (encoder->output_max_size < uVar3 + 1) {
      return -10;
    }
    iVar1 = 1;
  }
  else {
    if (0xffff < value) {
      if (value >> 0x20 == 0) {
        if (encoder->output_max_size < encoder->offset + 4) {
          return -10;
        }
        iVar4 = 0;
        iVar1 = 0x18;
        do {
          encoder->output_value[encoder->offset + iVar4] =
               (uint8_t)((uint)value >> ((byte)iVar1 & 0x1f));
          iVar4 = iVar4 + 1;
          iVar1 = iVar1 + -8;
        } while (iVar1 != -8);
        iVar1 = 4;
      }
      else {
        if (encoder->output_max_size < encoder->offset + 8) {
          return -10;
        }
        lVar2 = 0x38;
        iVar1 = 0;
        do {
          encoder->output_value[encoder->offset + iVar1] = (uint8_t)(value >> ((byte)lVar2 & 0x3f));
          lVar2 = lVar2 + -8;
          iVar1 = iVar1 + 1;
        } while (lVar2 != -8);
        iVar1 = 8;
      }
      goto LAB_0010f060;
    }
    if (encoder->output_max_size < encoder->offset + 2) {
      return -10;
    }
    encoder->output_value[encoder->offset] = (uint8_t)(value >> 8);
    uVar3 = encoder->offset + 1;
    iVar1 = 2;
  }
  encoder->output_value[uVar3] = (uint8_t)value;
LAB_0010f060:
  encoder->offset = encoder->offset + iVar1;
  return 0;
}

Assistant:

static inline int
encoder_append_uint_value(ndn_encoder_t* encoder, uint64_t value)
{
  if (value <= 255) {
    return encoder_append_byte_value(encoder, (uint8_t)value);
  }
  else if (value <= 0xFFFF) {
    return encoder_append_uint16_value(encoder, (uint16_t)value);
  }
  else if (value <= 0xFFFFFFFF) {
    return encoder_append_uint32_value(encoder, (uint32_t)value);
  }
  else {
    return encoder_append_uint64_value(encoder, value);
  }
}